

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid_checker.cpp
# Opt level: O3

string * __thiscall
duckdb::ValidChecker::InvalidatedMessage_abi_cxx11_
          (string *__return_storage_ptr__,ValidChecker *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->invalidated_msg)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->invalidated_msg)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

string ValidChecker::InvalidatedMessage() {
	lock_guard<mutex> l(invalidate_lock);
	return invalidated_msg;
}